

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg.cpp
# Opt level: O1

void __thiscall
spvtools::opt::CFG::ForEachBlockInReversePostOrder
          (CFG *this,BasicBlock *bb,function<void_(spvtools::opt::BasicBlock_*)> *f)

{
  _Manager_type p_Var1;
  _Any_data *p_Var2;
  _Any_data local_68;
  _Manager_type local_58;
  _Invoker_type p_Stack_50;
  _Any_data local_48;
  code *local_38;
  code *pcStack_30;
  
  local_58 = (_Manager_type)0x0;
  p_Stack_50 = (_Invoker_type)0x0;
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  p_Var1 = (f->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)(&local_68,(_Any_data *)f,__clone_functor);
    p_Stack_50 = f->_M_invoker;
    local_58 = (f->super__Function_base)._M_manager;
  }
  local_38 = (code *)0x0;
  pcStack_30 = (code *)0x0;
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  p_Var2 = (_Any_data *)operator_new(0x20);
  *(undefined8 *)p_Var2 = 0;
  *(char *)((long)p_Var2 + 8) = '\0';
  *(char *)((long)p_Var2 + 9) = '\0';
  *(char *)((long)p_Var2 + 10) = '\0';
  *(char *)((long)p_Var2 + 0xb) = '\0';
  *(char *)((long)p_Var2 + 0xc) = '\0';
  *(char *)((long)p_Var2 + 0xd) = '\0';
  *(char *)((long)p_Var2 + 0xe) = '\0';
  *(char *)((long)p_Var2 + 0xf) = '\0';
  *(char *)((long)p_Var2 + 0x10) = '\0';
  *(char *)((long)p_Var2 + 0x11) = '\0';
  *(char *)((long)p_Var2 + 0x12) = '\0';
  *(char *)((long)p_Var2 + 0x13) = '\0';
  *(char *)((long)p_Var2 + 0x14) = '\0';
  *(char *)((long)p_Var2 + 0x15) = '\0';
  *(char *)((long)p_Var2 + 0x16) = '\0';
  *(char *)((long)p_Var2 + 0x17) = '\0';
  *(char *)((long)p_Var2 + 0x18) = '\0';
  *(char *)((long)p_Var2 + 0x19) = '\0';
  *(char *)((long)p_Var2 + 0x1a) = '\0';
  *(char *)((long)p_Var2 + 0x1b) = '\0';
  *(char *)((long)p_Var2 + 0x1c) = '\0';
  *(char *)((long)p_Var2 + 0x1d) = '\0';
  *(char *)((long)p_Var2 + 0x1e) = '\0';
  *(char *)((long)p_Var2 + 0x1f) = '\0';
  if (local_58 != (_Manager_type)0x0) {
    (*local_58)(p_Var2,&local_68,__clone_functor);
    *(_Invoker_type *)(p_Var2->_M_pod_data + 0x18) = p_Stack_50;
    *(_Manager_type *)(p_Var2->_M_pod_data + 0x10) = local_58;
  }
  pcStack_30 = std::
               _Function_handler<bool_(spvtools::opt::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/cfg.cpp:120:40)>
               ::_M_invoke;
  local_38 = std::
             _Function_handler<bool_(spvtools::opt::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/cfg.cpp:120:40)>
             ::_M_manager;
  local_48._M_unused._0_8_ = p_Var2;
  WhileEachBlockInReversePostOrder
            (this,bb,(function<bool_(spvtools::opt::BasicBlock_*)> *)&local_48);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  if (local_58 != (_Manager_type)0x0) {
    (*local_58)(&local_68,&local_68,__destroy_functor);
  }
  return;
}

Assistant:

void CFG::ForEachBlockInReversePostOrder(
    BasicBlock* bb, const std::function<void(BasicBlock*)>& f) {
  WhileEachBlockInReversePostOrder(bb, [f](BasicBlock* b) {
    f(b);
    return true;
  });
}